

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QString>::QList(QList<QString> *this,qsizetype size)

{
  QArrayDataPointer<QString> *in_RSI;
  QArrayDataPointer<QString> *in_RDI;
  QArrayDataPointer<QString> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  AllocationOption in_stack_ffffffffffffffec;
  
  QArrayDataPointer<QString>::QArrayDataPointer
            (unaff_retaddr,(qsizetype)in_RDI,(qsizetype)in_RSI,in_stack_ffffffffffffffec);
  if (in_RSI != (QArrayDataPointer<QString> *)0x0) {
    QArrayDataPointer<QString>::operator->(in_RDI);
    QArrayDataPointer<QString>::appendInitialize
              (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }